

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_output_auth(connectdata *conn,char *request,char *path,_Bool proxytunnel)

{
  auth *authstatus;
  auth *authstatus_00;
  undefined1 *puVar1;
  uint uVar2;
  Curl_easy *pCVar3;
  unsigned_long uVar4;
  char *first;
  CURLcode CVar5;
  int iVar6;
  
  pCVar3 = conn->data;
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if (((char)uVar2 < '\0' || (~uVar2 & 0x120) == 0) || (conn->oauth_bearer != (char *)0x0)) {
    authstatus = &(pCVar3->state).authhost;
    authstatus_00 = &(pCVar3->state).authproxy;
    uVar4 = authstatus->want;
    if ((uVar4 != 0) && ((pCVar3->state).authhost.picked == 0)) {
      (pCVar3->state).authhost.picked = uVar4;
    }
    uVar4 = authstatus_00->want;
    if ((uVar4 != 0) && ((pCVar3->state).authproxy.picked == 0)) {
      (pCVar3->state).authproxy.picked = uVar4;
    }
    uVar2 = *(uint *)&(conn->bits).field_0x4;
    if (((uVar2 & 0x20) == 0) || (((uVar2 >> 0xe & 1) == 0) == proxytunnel)) {
      puVar1 = &(pCVar3->state).authproxy.field_0x18;
      *puVar1 = *puVar1 | 1;
    }
    else {
      CVar5 = output_auth_headers(conn,authstatus_00,request,path,true);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
    }
    if ((((((pCVar3->state).field_0x4e4 & 2) == 0) || (((conn->bits).field_0x6 & 0x10) != 0)) ||
        (first = (pCVar3->state).first_host, first == (char *)0x0)) ||
       ((((pCVar3->set).field_0x87b & 1) != 0 ||
        (iVar6 = Curl_strcasecompare(first,(conn->host).name), iVar6 != 0)))) {
      CVar5 = output_auth_headers(conn,authstatus,request,path,false);
      return CVar5;
    }
    puVar1 = &(pCVar3->state).authhost.field_0x18;
    *puVar1 = *puVar1 | 1;
  }
  else {
    puVar1 = &(pCVar3->state).authhost.field_0x18;
    *puVar1 = *puVar1 | 1;
    puVar1 = &(pCVar3->state).authproxy.field_0x18;
    *puVar1 = *puVar1 | 1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode
Curl_http_output_auth(struct connectdata *conn,
                      const char *request,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if((conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
     conn->bits.user_passwd || conn->oauth_bearer)
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
     (conn->bits.tunnel_proxy == (bit)proxytunnel)) {
    result = output_auth_headers(conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original
     host due to a location-follow, we do some weirdo checks here */
  if(!data->state.this_is_a_follow ||
     conn->bits.netrc ||
     !data->state.first_host ||
     data->set.allow_auth_to_other_hosts ||
     strcasecompare(data->state.first_host, conn->host.name)) {
    result = output_auth_headers(conn, authhost, request, path, FALSE);
  }
  else
    authhost->done = TRUE;

  return result;
}